

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

int __thiscall
MeCab::DecoderFeatureIndex::open(DecoderFeatureIndex *this,char *__file,int __oflag,...)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char *in_stack_00000010;
  Param *in_stack_00000018;
  Param *in_stack_00000070;
  DecoderFeatureIndex *in_stack_00000078;
  string modelfile;
  Param *in_stack_000003f8;
  FeatureIndex *in_stack_00000400;
  die local_45 [13];
  string local_38 [16];
  Param *in_stack_ffffffffffffffd8;
  DecoderFeatureIndex *in_stack_ffffffffffffffe0;
  
  Param::get<std::__cxx11::string>(in_stack_00000018,in_stack_00000010);
  bVar1 = openBinaryModel(in_stack_00000078,in_stack_00000070);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,local_38);
    poVar2 = std::operator<<(poVar2," is not a binary model. reopen it as text mode...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    bVar1 = openTextModel(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (!bVar1) {
      die::die(local_45);
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7c);
      poVar2 = std::operator<<(poVar2,") [");
      poVar2 = std::operator<<(poVar2,"openTextModel(param)");
      poVar2 = std::operator<<(poVar2,"] ");
      poVar2 = std::operator<<(poVar2,"no such file or directory: ");
      poVar2 = std::operator<<(poVar2,local_38);
      die::operator&(local_45,poVar2);
      die::~die((die *)0x1e75d0);
    }
  }
  bVar1 = FeatureIndex::openTemplate(in_stack_00000400,in_stack_000003f8);
  if (!bVar1) {
    (*(this->super_FeatureIndex)._vptr_FeatureIndex[2])();
  }
  uVar3 = std::__cxx11::string::~string(local_38);
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),bVar1);
}

Assistant:

bool DecoderFeatureIndex::open(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  // open the file as binary mode again and fallback to text file
  if (!openBinaryModel(param)) {
    std::cout << modelfile
              << " is not a binary model. reopen it as text mode..."
              << std::endl;
    CHECK_DIE(openTextModel(param)) <<
        "no such file or directory: " << modelfile;
  }

  if (!openTemplate(param)) {
    close();
    return false;
  }

  return true;
}